

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

void lua_callk(lua_State *L,int nargs,int nresults,lua_KContext ctx,lua_KFunction k)

{
  StkId pSVar1;
  
  pSVar1 = (L->top).p;
  if ((k == (lua_KFunction)0x0) || (0xffff < L->nCcalls)) {
    luaD_callnoyield(L,pSVar1 + ~nargs,nresults);
  }
  else {
    (L->ci->u).c.k = k;
    (L->ci->u).c.ctx = ctx;
    luaD_call(L,pSVar1 + ~nargs,nresults);
  }
  if (nresults < 0) {
    if ((L->ci->top).p < (L->top).p) {
      (L->ci->top).p = (L->top).p;
    }
  }
  return;
}

Assistant:

LUA_API void lua_callk (lua_State *L, int nargs, int nresults,
                        lua_KContext ctx, lua_KFunction k) {
  StkId func;
  lua_lock(L);
  api_check(L, k == NULL || !isLua(L->ci),
    "cannot use continuations inside hooks");
  api_checknelems(L, nargs+1);
  api_check(L, L->status == LUA_OK, "cannot do calls on non-normal thread");
  checkresults(L, nargs, nresults);
  func = L->top.p - (nargs+1);
  if (k != NULL && yieldable(L)) {  /* need to prepare continuation? */
    L->ci->u.c.k = k;  /* save continuation */
    L->ci->u.c.ctx = ctx;  /* save context */
    luaD_call(L, func, nresults);  /* do the call */
  }
  else  /* no continuation or no yieldable */
    luaD_callnoyield(L, func, nresults);  /* just do the call */
  adjustresults(L, nresults);
  lua_unlock(L);
}